

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall wabt::Var::set_name(Var *this,string *name)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  if ((this->type_ == Name) &&
     (pcVar3 = (this->field_2).name_._M_dataplus._M_p,
     pcVar3 != (pointer)((long)&this->field_2 + 0x10))) {
    operator_delete(pcVar3);
  }
  this->type_ = Name;
  psVar1 = (size_type *)((long)&this->field_2 + 0x10);
  *(size_type **)&this->field_2 = psVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    *psVar1 = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&this->field_2 + 0x18) = uVar4;
  }
  else {
    (this->field_2).name_._M_dataplus._M_p = pcVar3;
    *(size_type *)((long)&this->field_2 + 0x10) = paVar2->_M_allocated_capacity;
  }
  (this->field_2).name_._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

void Var::set_name(std::string&& name) {
  Destroy();
  type_ = VarType::Name;
  Construct(name_, std::move(name));
}